

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O0

void google::protobuf::
     STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<google::protobuf::FileDescriptorProto_const**,std::vector<google::protobuf::FileDescriptorProto_const*,std::allocator<google::protobuf::FileDescriptorProto_const*>>>>
               (__normal_iterator<const_google::protobuf::FileDescriptorProto_**,_std::vector<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>_>
                begin,__normal_iterator<const_google::protobuf::FileDescriptorProto_**,_std::vector<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>_>
                      end)

{
  bool bVar1;
  reference ppFVar2;
  __normal_iterator<const_google::protobuf::FileDescriptorProto_**,_std::vector<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>_>
  local_20;
  __normal_iterator<const_google::protobuf::FileDescriptorProto_**,_std::vector<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>_>
  temp;
  __normal_iterator<const_google::protobuf::FileDescriptorProto_**,_std::vector<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>_>
  end_local;
  __normal_iterator<const_google::protobuf::FileDescriptorProto_**,_std::vector<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>_>
  begin_local;
  
  temp._M_current = end._M_current;
  end_local._M_current = begin._M_current;
  while (bVar1 = __gnu_cxx::operator!=(&end_local,&temp), bVar1) {
    local_20._M_current = end_local._M_current;
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FileDescriptorProto_**,_std::vector<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>_>
    ::operator++(&end_local);
    ppFVar2 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FileDescriptorProto_**,_std::vector<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>_>
              ::operator*(&local_20);
    if (*ppFVar2 != (FileDescriptorProto *)0x0) {
      (*((*ppFVar2)->super_Message).super_MessageLite._vptr_MessageLite[1])();
    }
  }
  return;
}

Assistant:

void STLDeleteContainerPointers(ForwardIterator begin,
                                ForwardIterator end) {
  while (begin != end) {
    ForwardIterator temp = begin;
    ++begin;
    delete *temp;
  }
}